

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_b88b95.c
# Opt level: O3

void xc_hyb_mgga_xc_pwb6k_init(xc_func_type *p)

{
  xc_mix_init(p,2,xc_hyb_mgga_xc_pwb6k_init::funcs_id,xc_hyb_mgga_xc_pwb6k_init::funcs_coef);
  xc_func_set_ext_params(*p->func_aux,xc_hyb_mgga_xc_pwb6k_init::par_x_pw91);
  xc_func_set_ext_params(p->func_aux[1],xc_hyb_mgga_xc_pwb6k_init::par_c_bc95);
  xc_hyb_init_hybrid(p,0.46);
  return;
}

Assistant:

void
xc_hyb_mgga_xc_pwb6k_init(xc_func_type *p)
{
  static int    funcs_id  [2] = {XC_GGA_X_MPW91, XC_MGGA_C_BC95};
  static double funcs_coef[2] = {1.0 - 0.46, 1.0};

  static double par_x_pw91[] = {0.00539, 1.7077/(X2S*X2S), 4.0876};
  static double par_c_bc95[] = {0.04120, 0.00353};

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_func_set_ext_params(p->func_aux[0], par_x_pw91);
  xc_func_set_ext_params(p->func_aux[1], par_c_bc95);

  xc_hyb_init_hybrid(p, 0.46);
}